

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenRefCast(BinaryenModuleRef module,BinaryenExpressionRef ref,BinaryenType type)

{
  RefCast *this;
  
  this = (RefCast *)MixedArena::allocSpace(&module->allocator,0x18,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)63>).super_Expression._id = RefCastId;
  this->ref = ref;
  (this->super_SpecificExpression<(wasm::Expression::Id)63>).super_Expression.type.id = type;
  wasm::RefCast::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenRefCast(BinaryenModuleRef module,
                                      BinaryenExpressionRef ref,
                                      BinaryenType type) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeRefCast((Expression*)ref, Type(type)));
}